

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestGroupExtension::~TestGroupExtension(TestGroupExtension *this)

{
  TestGroupExtension *this_local;
  
  SharedDtor((MessageLite *)this);
  google::protobuf::Message::~Message(&this->super_Message);
  return;
}

Assistant:

TestGroupExtension::~TestGroupExtension() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestGroupExtension)
  SharedDtor(*this);
}